

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void duckdb_fastpforlib::internal::Unroller<(unsigned_short)24,_(unsigned_short)24>::Pack
               (uint32_t *in,uint32_t *out)

{
  *out = in[0x18] & 0xffffff;
  Unroller<(unsigned_short)24,_(unsigned_short)25>::Pack(in,out);
  return;
}

Assistant:

static void Pack(const uint32_t *__restrict in, uint32_t *__restrict out) {
		pack_single_in<uint32_t, DELTA, (DELTA * OINDEX) % 32, (1U << DELTA) - 1>(in[OINDEX], out);

		Unroller<DELTA, OINDEX + 1>::Pack(in, out);
	}